

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  ushort uVar1;
  undefined8 uVar2;
  int iVar3;
  ParameterError PVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  CURLSH *share;
  per_transfer *ppVar8;
  timediff_t tVar9;
  per_transfer **pppVar10;
  long lVar11;
  time_t tVar12;
  long lVar13;
  GlobalConfig *pGVar14;
  char *__s1;
  size_t i;
  ulong uVar15;
  OperationConfig *config;
  bool bVar16;
  curltime cVar17;
  curltime newer;
  _Bool retry_1;
  _Bool retry;
  _Bool skipped;
  undefined7 uStack_9f;
  _Bool added;
  undefined7 uStack_97;
  GlobalConfig *local_90;
  CURLM *local_88;
  CURLSH *local_80;
  undefined8 local_78;
  int local_70;
  curltime local_68;
  _Bool local_58;
  _Bool local_57;
  undefined2 local_56;
  time_t local_50;
  int local_44;
  CURLSH *local_40;
  time_t local_38;
  
  if (argc < 2) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = argv[1];
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (((argc == 1) ||
      ((__s1 != (char *)0x0 &&
       (((*__s1 != '-' || (__s1[1] != 'q')) && (iVar3 = strcmp(__s1,"--disable"), iVar3 != 0))))))
     && ((parseconfig((char *)0x0,global), argc < 2 && (global->first->url_list == (getout *)0x0))))
  {
    helpf(tool_stderr,(char *)0x0);
    goto switchD_00114b67_caseD_a;
  }
  PVar4 = parse_args(global,argc,argv);
  CVar7 = CURLE_OK;
  CVar5 = CURLE_OK;
  switch(PVar4) {
  case PARAM_HELP_REQUESTED:
    tool_help(global->help_category);
    CVar5 = CVar7;
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    CVar5 = CVar7;
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    CVar5 = CVar7;
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines();
    CVar5 = CVar7;
    break;
  case PARAM_CA_EMBED_REQUESTED:
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case PARAM_READ_ERROR:
    CVar5 = CURLE_READ_ERROR;
    break;
  default:
    if (PVar4 == PARAM_OK) {
      if ((global->libcurl == (char *)0x0) || (CVar5 = easysrc_init(), CVar5 == CURLE_OK)) {
        config = global->first;
        share = (CURLSH *)curl_share_init();
        if (share == (CURLSH *)0x0) {
          CVar5 = CURLE_OUT_OF_MEMORY;
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
          }
        }
        else {
          curl_share_setopt(share,1,2);
          curl_share_setopt(share,1,3);
          curl_share_setopt(share,1,4);
          if ((global->field_0x63 & 1) == 0) {
            curl_share_setopt(share,1,5);
          }
          curl_share_setopt(share,1,6);
          curl_share_setopt(share,1,7);
          if (((global->ssl_sessions == (char *)0x0) || (feature_ssls_export != true)) ||
             (CVar5 = tool_ssls_load(global,global->first,share,global->ssl_sessions),
             CVar5 == CURLE_OK)) {
            i = 0;
            do {
              CVar5 = get_args(config,i);
              if (CVar5 != CURLE_OK) break;
              i = i + 1;
              config = config->next;
            } while (config != (OperationConfig *)0x0);
            global->current = global->first;
            uVar1 = *(ushort *)&global->field_0x63;
            if (CVar5 == CURLE_OK) {
              if ((uVar1 & 1) == 0) {
                added = false;
                skipped = false;
                CVar5 = create_transfer(global,share,&added,&skipped);
                if (CVar5 == CURLE_OK) {
                  if (added == false) {
                    errorf(global,"no transfer performed");
                    CVar5 = CURLE_READ_ERROR;
                  }
                  else {
                    CVar5 = CURLE_OK;
                    ppVar8 = transfers;
                    CVar7 = CURLE_OK;
                    while (ppVar8 != (per_transfer *)0x0) {
                      cVar17 = curlx_now();
                      local_38 = cVar17.tv_sec;
                      local_44 = cVar17.tv_usec;
                      if ((ppVar8->field_0x1d8 & 0x20) == 0) {
                        CVar5 = pre_transfer(global,ppVar8);
                        if ((CVar5 != CURLE_OK) ||
                           ((global->libcurl != (char *)0x0 &&
                            (CVar5 = easysrc_perform(), CVar5 != CURLE_OK)))) break;
                        CVar5 = curl_easy_perform(ppVar8->curl);
                      }
                      CVar6 = post_per_transfer(global,ppVar8,CVar5,&retry,(long *)&local_90);
                      pGVar14 = local_90;
                      if (retry == true) {
LAB_00114da6:
                        tool_go_sleep((long)pGVar14);
                        CVar7 = CVar6;
                      }
                      else {
                        bVar16 = true;
                        CVar7 = CVar6;
                        if (CVar6 < CURLE_SETOPT_OPTION_SYNTAX) {
                          if ((0x1080008000004U >> ((ulong)CVar6 & 0x3f) & 1) == 0) {
                            if ((ulong)CVar6 != 0) goto LAB_00114e4e;
                            goto LAB_00114e58;
                          }
                        }
                        else {
LAB_00114e4e:
                          if ((global->field_0x63 & 4) == 0) {
LAB_00114e58:
                            do {
                              CVar7 = create_transfer(global,share,&added,&skipped);
                              bVar16 = CVar7 != CURLE_OK;
                              CVar5 = CVar7;
                              if (bVar16) goto LAB_00114dd0;
                            } while (skipped != false);
                            CVar7 = CVar6;
                            CVar5 = CURLE_OK;
                          }
                        }
LAB_00114dd0:
                        ppVar8 = del_per_transfer(ppVar8);
                        if (bVar16) break;
                        if (ppVar8 == (per_transfer *)0x0) {
                          ppVar8 = (per_transfer *)0x0;
                        }
                        else if (global->ms_per_transfer != 0) {
                          cVar17 = curlx_now();
                          newer._12_4_ = 0;
                          newer.tv_sec = SUB128(cVar17._0_12_,0);
                          newer.tv_usec = SUB124(cVar17._0_12_,8);
                          cVar17.tv_usec = local_44;
                          cVar17.tv_sec = local_38;
                          cVar17._12_4_ = 0;
                          tVar9 = curlx_timediff(newer,cVar17);
                          if (tVar9 < global->ms_per_transfer) {
                            notef(global,"Transfer took %ld ms, waits %ldms as set by --rate",tVar9)
                            ;
                            pGVar14 = (GlobalConfig *)(global->ms_per_transfer - tVar9);
                            CVar6 = CVar7;
                            goto LAB_00114da6;
                          }
                        }
                      }
                    }
                    if (CVar7 != CURLE_OK) {
                      CVar5 = CVar7;
                    }
                    if (CVar5 == CURLE_OK) {
                      CVar5 = CURLE_OK;
                    }
                    else {
                      single_transfer_cleanup(global->current);
                    }
                  }
                }
              }
              else {
                local_78 = 0;
                local_70 = 1;
                local_80 = share;
                cVar17 = curlx_now();
                local_68.tv_sec = cVar17.tv_sec;
                local_68.tv_usec = cVar17.tv_usec;
                local_56 = 0;
                local_50 = time((time_t *)0x0);
                local_90 = global;
                local_88 = (CURLM *)curl_multi_init();
                CVar5 = CURLE_OUT_OF_MEMORY;
                if (local_88 != (CURLM *)0x0) {
                  CVar5 = add_parallel_transfers(global,local_88,share,&local_58,&local_57);
                  if (CVar5 == CURLE_OK) {
                    if (all_added == 0) {
                      CVar7 = CURLE_OK;
                    }
                    else {
                      uVar15 = 0;
LAB_00114f2f:
                      CVar7 = (CURLcode)uVar15;
                      if ((int)local_78 == 0) {
                        if (local_70 == 0) {
                          if ((local_58 != true) || ((char)local_56 != '\0')) goto LAB_001151ce;
                        }
                        else if (((char)local_56 == '\x01') && (local_56._1_1_ == '\0')) {
                          pppVar10 = &transfers;
                          while (pppVar10 = &((per_transfer *)pppVar10)->next->next,
                                (per_transfer *)pppVar10 != (per_transfer *)0x0) {
                            if ((((per_transfer *)pppVar10)->field_0x1d8 & 8) != 0) {
                              ((per_transfer *)pppVar10)->field_0x1d8 =
                                   ((per_transfer *)pppVar10)->field_0x1d8 | 0x10;
                            }
                          }
                          local_56 = 0x101;
                        }
                        iVar3 = curl_multi_poll(local_88,0,0,1000,0);
                        local_78 = CONCAT44(local_78._4_4_,iVar3);
                        if (iVar3 == 0) {
                          iVar3 = curl_multi_perform(local_88);
                          pGVar14 = local_90;
                          local_78 = CONCAT44(local_78._4_4_,iVar3);
                          if (iVar3 == 0) {
                            bVar16 = false;
                            progress_meter(local_90,&local_68,false);
                            uVar15 = 0;
                            while( true ) {
                              lVar11 = curl_multi_info_read();
                              if (lVar11 == 0) break;
                              uVar2 = *(undefined8 *)(lVar11 + 8);
                              CVar5 = *(CURLcode *)(lVar11 + 0x10);
                              curl_easy_getinfo(uVar2,0x100015,&skipped);
                              curl_multi_remove_handle(local_88,uVar2);
                              ppVar8 = (per_transfer *)CONCAT71(uStack_9f,skipped);
                              if ((((ppVar8->field_0x1d8 & 0x10) != 0) &&
                                  (CVar5 == CURLE_ABORTED_BY_CALLBACK)) &&
                                 (ppVar8->errorbuffer != (char *)0x0)) {
                                curl_msnprintf(ppVar8->errorbuffer,0x100,
                                               "Transfer aborted due to critical error in another transfer"
                                              );
                                ppVar8 = (per_transfer *)CONCAT71(uStack_9f,skipped);
                              }
                              CVar5 = post_per_transfer(pGVar14,ppVar8,CVar5,&retry_1,(long *)&added
                                                       );
                              progress_finalize((per_transfer *)CONCAT71(uStack_9f,skipped));
                              all_added = all_added + -1;
                              if (retry_1 == true) {
                                lVar11 = CONCAT71(uStack_9f,skipped);
                                *(byte *)(lVar11 + 0x1d8) = *(byte *)(lVar11 + 0x1d8) & 0xf7;
                                lVar13 = CONCAT71(uStack_97,added);
                                if (lVar13 == 0) {
                                  lVar13 = 0;
                                }
                                else {
                                  tVar12 = time((time_t *)0x0);
                                  lVar13 = lVar13 / 1000 + tVar12;
                                  lVar11 = CONCAT71(uStack_9f,skipped);
                                }
                                *(long *)(lVar11 + 0x188) = lVar13;
                              }
                              else {
                                if (CVar5 != CURLE_OK) {
                                  if ((int)uVar15 == 0) {
                                    uVar15 = (ulong)CVar5;
                                  }
                                  if ((*(byte *)(CONCAT71(uStack_9f,skipped) + 0x1d8) & 0x10) == 0)
                                  {
                                    uVar15 = (ulong)CVar5;
                                  }
                                }
                                if ((uint)uVar15 < 0x31) {
                                  if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) != 0)
                                  goto LAB_001150f9;
                                  if (uVar15 != 0) goto LAB_00115120;
                                }
                                else {
LAB_00115120:
                                  if ((pGVar14->field_0x63 & 4) != 0) {
LAB_001150f9:
                                    local_56 = CONCAT11(local_56._1_1_,1);
                                  }
                                }
                                del_per_transfer((per_transfer *)CONCAT71(uStack_9f,skipped));
                              }
                              bVar16 = true;
                            }
                            if ((char)local_56 == '\0') {
                              tVar12 = local_50;
                              if ((bVar16) || (tVar12 = time((time_t *)0x0), local_50 != tVar12)) {
                                local_50 = tVar12;
                                CVar5 = add_parallel_transfers
                                                  (pGVar14,local_88,local_80,&local_58,&local_57);
                                if (CVar5 != CURLE_OK) {
                                  uVar15 = (ulong)CVar5;
                                }
                                if (local_57 == true) {
                                  local_70 = 1;
                                }
                              }
                              if ((uint)uVar15 < 0x31) {
                                if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) == 0) {
                                  if (uVar15 != 0) goto LAB_001151b0;
                                  goto LAB_00114f2f;
                                }
                              }
                              else {
LAB_001151b0:
                                if ((pGVar14->field_0x63 & 4) == 0) goto LAB_00114f2f;
                              }
                              local_56 = CONCAT11(local_56._1_1_,1);
                            }
                          }
                        }
                        goto LAB_00114f2f;
                      }
LAB_001151ce:
                      progress_meter(global,&local_68,true);
                    }
                    CVar5 = (uint)((int)local_78 != 3) * 0x10 + CURLE_OUT_OF_MEMORY;
                    if ((int)local_78 == 0) {
                      CVar5 = CVar7;
                    }
                  }
                  curl_multi_cleanup(local_88);
                }
              }
            }
            local_40 = share;
            for (ppVar8 = transfers; share = local_40, ppVar8 != (per_transfer *)0x0;
                ppVar8 = del_per_transfer(ppVar8)) {
              CVar7 = post_per_transfer(global,ppVar8,CVar5,&added,(long *)&local_90);
              if (CVar5 == CURLE_OK) {
                CVar5 = CVar7;
              }
              clean_getout(ppVar8->config);
            }
            *(ushort *)&global->field_0x63 = uVar1 & 0x600 | *(ushort *)&global->field_0x63 & 63999;
            if ((global->ssl_sessions != (char *)0x0) && (feature_ssls_export == true)) {
              CVar6 = tool_ssls_save(global,global->first,local_40,global->ssl_sessions);
              CVar7 = CVar6;
              if (CVar5 != CURLE_OK) {
                CVar7 = CVar5;
              }
              if (CVar6 != CURLE_OK) {
                CVar5 = CVar7;
              }
            }
          }
          curl_share_cleanup(share);
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
            dumpeasysrc(global);
          }
        }
      }
      else {
        errorf(global,"out of memory");
      }
      break;
    }
  case PARAM_GOT_EXTRA_PARAMETER:
  case PARAM_BAD_NUMERIC:
  case PARAM_NEGATIVE_NUMERIC:
  case PARAM_LIBCURL_DOESNT_SUPPORT:
  case PARAM_NO_MEM:
  case PARAM_NEXT_OPERATION:
  case PARAM_NO_PREFIX:
  case PARAM_NUMBER_TOO_LARGE:
  case PARAM_NO_NOT_BOOLEAN:
  case PARAM_CONTDISP_RESUME_FROM:
switchD_00114b67_caseD_a:
    CVar5 = CURLE_FAILED_INIT;
  }
  varcleanup(global);
  curl_free(global->knownhosts);
  return CVar5;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  const char *first_arg;
#ifdef UNDER_CE
  first_arg = argc > 1 ? strdup(argv[1]) : NULL;
#else
  first_arg = argc > 1 ? convert_tchar_to_UTF8(argv[1]) : NULL;
#endif

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED) {
#ifdef USE_MANUAL
        hugehelp();
#else
        puts("built-in manual was disabled at build-time");
#endif
      }
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          /* Running parallel, use the multi connection cache */
          if(!global->parallel)
            curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          if(global->ssl_sessions && feature_ssls_export)
            result = tool_ssls_load(global, global->first, share,
                                    global->ssl_sessions);

          if(!result) {
            /* Get the required arguments for each operation */
            do {
              result = get_args(operation, count++);

              operation = operation->next;
            } while(!result && operation);

            /* Set the current operation pointer */
            global->current = global->first;

            /* now run! */
            result = run_all_transfers(global, share, result);

            if(global->ssl_sessions && feature_ssls_export) {
              CURLcode r2 = tool_ssls_save(global, global->first, share,
                                           global->ssl_sessions);
              if(r2 && !result)
                result = r2;
            }
          }

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);
  curl_free(global->knownhosts);

  return result;
}